

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

Trace * jit_trace_new(VM *vm)

{
  Trace *pTVar1;
  IrIns *pIVar2;
  Trace *trace;
  VM *vm_local;
  
  pTVar1 = (Trace *)malloc(0x20218);
  pTVar1->vm = vm;
  pTVar1->ir_count = 1;
  pTVar1->ir_capacity = 0x100;
  pIVar2 = (IrIns *)malloc((long)pTVar1->ir_capacity << 3);
  pTVar1->ir = pIVar2;
  memset(pTVar1->last_modified,0,0x1fe);
  memset(pTVar1->const_loads,0,0x1fffe);
  return pTVar1;
}

Assistant:

Trace * jit_trace_new(VM *vm) {
	Trace *trace = malloc(sizeof(Trace));
	trace->vm = vm;
	trace->ir_count = 1;
	trace->ir_capacity = 256;
	trace->ir = malloc(sizeof(IrIns) * trace->ir_capacity);

	// These arrays have a default value to indicate "not set yet".
	memset(trace->last_modified, IR_NONE, sizeof(IrRef) * MAX_LOCALS_IN_FN);
	memset(trace->const_loads, IR_NONE, sizeof(IrRef) * MAX_CONSTS);
	return trace;
}